

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeTest(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *__return_storage_ptr__,
             SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,int i)

{
  Status stat;
  pointer pnVar1;
  long lVar2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  cpp_dec_float<200U,_int,_void> *this_00;
  cpp_dec_float<200U,_int,_void> *pcVar4;
  byte bVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  
  bVar5 = 0;
  stat = ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thedesc.stat)->data[i];
  if (this->theRep * stat < 1) {
    test(&local_a0,this,i,stat);
    pnVar1 = (this->theTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_00 = &pnVar1[i].m_backend;
    pnVar3 = &local_a0;
    pcVar4 = this_00;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      (((cpp_dec_float<200U,_int,_void> *)&pcVar4->data)->data)._M_elems[0] =
           (pnVar3->m_backend).data._M_elems[0];
      pnVar3 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar3 + ((ulong)bVar5 * -2 + 1) * 4);
      pcVar4 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar4 + (ulong)bVar5 * -8 + 4);
    }
    pnVar1[i].m_backend.exp = local_a0.m_backend.exp;
    pnVar1[i].m_backend.neg = local_a0.m_backend.neg;
    pnVar1[i].m_backend.fpclass = local_a0.m_backend.fpclass;
    pnVar1[i].m_backend.prec_elem = local_a0.m_backend.prec_elem;
  }
  else {
    this_00 = &(this->theTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(this_00,0);
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (&__return_storage_ptr__->m_backend,this_00);
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::computeTest(int i)
{
   typename SPxBasisBase<R>::Desc::Status stat = this->desc().status(i);

   if(isBasic(stat))
      return theTest[i] = 0;
   else
      return theTest[i] = test(i, stat);
}